

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O3

void __thiscall
Scine::Core::ModuleManager::Impl::load(Impl *this,shared_ptr<Scine::Core::Module> *module)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  _Var2;
  ModulePtr local_48;
  LibraryAndModules local_30;
  
  p_Var1 = (module->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  local_48.super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (module->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (module->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
    }
  }
  LibraryAndModules::LibraryAndModules(&local_30,&local_48);
  if (local_48.super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Scine::Core::Module>*,std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>,__gnu_cxx::__ops::_Iter_pred<Scine::Core::ModuleManager::Impl::load(std::shared_ptr<Scine::Core::Module>)::_lambda(auto:1_const&)_1_>>
                    (local_30.modules.
                     super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_30.modules.
                     super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,this);
  if (_Var2._M_current ==
      local_30.modules.
      super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
    ::emplace_back<Scine::Core::ModuleManager::Impl::LibraryAndModules>(&this->_sources,&local_30);
  }
  std::
  vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
  ::~vector(&local_30.modules);
  if (local_30.library.super_shared_library_impl.handle_ != (native_handle_t)0x0) {
    dlclose();
  }
  return;
}

Assistant:

void load(std::shared_ptr<Module> module) {
    LibraryAndModules lib{module};

    const bool alreadyLoaded = std::any_of(std::begin(lib.modules), std::end(lib.modules),
                                           [&](const auto& modulePtr) -> bool { return moduleLoaded(modulePtr->name()); });

    if (!alreadyLoaded) {
      _sources.push_back(std::move(lib));
    }
  }